

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O2

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureUpdateCommand>
          (CCommandBuffer *this,CTextureUpdateCommand *Command)

{
  CCommand *pCVar1;
  CCommand *pCVar2;
  CCommand *pCVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CCommand *pCVar9;
  
  pCVar9 = (CCommand *)CBuffer::Alloc(&this->m_CmdBuffer,0x30,8);
  if (pCVar9 != (CCommand *)0x0) {
    uVar4 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar1 = (Command->super_CCommand).m_pNext;
    iVar7 = Command->m_Slot;
    iVar8 = Command->m_X;
    pCVar2 = *(CCommand **)&Command->m_Y;
    iVar5 = Command->m_Height;
    iVar6 = Command->m_Format;
    pCVar3 = (CCommand *)Command->m_pData;
    pCVar9->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar9->field_0x4 = uVar4;
    pCVar9->m_pNext = pCVar1;
    pCVar9[2].m_Cmd = iVar5;
    *(int *)&pCVar9[2].field_0x4 = iVar6;
    pCVar9[2].m_pNext = pCVar3;
    pCVar9[1].m_Cmd = iVar7;
    *(int *)&pCVar9[1].field_0x4 = iVar8;
    pCVar9[1].m_pNext = pCVar2;
    pCVar9->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar9;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar9;
    }
    this->m_pCmdBufferTail = pCVar9;
  }
  return pCVar9 != (CCommand *)0x0;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}